

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O1

BasicResult<clara::detail::ParseState> *
clara::detail::BasicResult<clara::detail::ParseState>::ok<clara::detail::ParseState>
          (BasicResult<clara::detail::ParseState> *__return_storage_ptr__,ParseState *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.m_type
       = Ok;
  (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_0011c640;
  (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).field_0.m_value.m_type
       = value->m_type;
  pbVar1 = (value->m_remainingTokens).itEnd._M_current;
  (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).field_0.m_value.
  m_remainingTokens.it._M_current = (value->m_remainingTokens).it._M_current;
  (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).field_0.m_value.
  m_remainingTokens.itEnd._M_current = pbVar1;
  std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::vector
            (&(__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).field_0.
              m_value.m_remainingTokens.m_tokenBuffer,&(value->m_remainingTokens).m_tokenBuffer);
  (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0011c5e8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static auto ok( U const &value ) -> BasicResult { return { ResultBase::Ok, value }; }